

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

int __thiscall
kj::anon_unknown_123::AggregateConnectionReceiver::accept
          (AggregateConnectionReceiver *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  PromiseArena *pPVar1;
  ConnectionReceiver CVar2;
  PromiseArenaMember *in_RAX;
  void *pvVar3;
  TransformPromiseNodeBase *this_00;
  ConnectionReceiver local_28;
  
  local_28._vptr_ConnectionReceiver = (_func_int **)in_RAX;
  acceptAuthenticated((AggregateConnectionReceiver *)&stack0xffffffffffffffd8);
  CVar2._vptr_ConnectionReceiver = local_28._vptr_ConnectionReceiver;
  pPVar1 = (PromiseArena *)local_28._vptr_ConnectionReceiver[1];
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_28._vptr_ConnectionReceiver - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&stack0xffffffffffffffd8,
               kj::_::
               SimpleTransformPromiseNode<kj::AuthenticatedStream,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2854:39)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_0070ccf0;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    local_28._vptr_ConnectionReceiver[1] = (_func_int *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_28._vptr_ConnectionReceiver + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&stack0xffffffffffffffd8,
               kj::_::
               SimpleTransformPromiseNode<kj::AuthenticatedStream,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2854:39)>
               ::anon_class_1_0_00000001_for_func::operator());
    CVar2._vptr_ConnectionReceiver[-5] = (_func_int *)&PTR_destroy_0070ccf0;
    ((PromiseArenaMember *)(CVar2._vptr_ConnectionReceiver + -4))->_vptr_PromiseArenaMember =
         (_func_int **)pPVar1;
  }
  CVar2._vptr_ConnectionReceiver = local_28._vptr_ConnectionReceiver;
  (this->super_ConnectionReceiver)._vptr_ConnectionReceiver = (_func_int **)this_00;
  if ((PromiseArenaMember *)local_28._vptr_ConnectionReceiver != (PromiseArenaMember *)0x0) {
    local_28._vptr_ConnectionReceiver = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)CVar2._vptr_ConnectionReceiver);
  }
  return (int)this;
}

Assistant:

Promise<Own<AsyncIoStream>> accept() override {
    return acceptAuthenticated().then([](AuthenticatedStream&& authenticated) {
      return kj::mv(authenticated.stream);
    });
  }